

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restarts.cc
# Opt level: O1

void __thiscall
gss::LubyRestartsSchedule::LubyRestartsSchedule
          (LubyRestartsSchedule *this,LubyRestartsSchedule *other)

{
  _List_node_base *p_Var1;
  long lVar2;
  _List_node_base *p_Var3;
  
  (this->super_RestartsSchedule)._vptr_RestartsSchedule =
       (_func_int **)&PTR__LubyRestartsSchedule_001ed1b0;
  this->_backtracks_remaining = other->_backtracks_remaining;
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::list
            (&this->_sequence,&other->_sequence);
  p_Var1 = (this->_sequence).super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node
           .super__List_node_base._M_next;
  (this->_current_sequence)._M_node = p_Var1;
  lVar2 = 0;
  for (p_Var3 = (other->_sequence).super__List_base<long_long,_std::allocator<long_long>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var3 != (other->_current_sequence)._M_node;
      p_Var3 = p_Var3->_M_next) {
    lVar2 = lVar2 + 1;
  }
  if (lVar2 < 1) {
    if (lVar2 == 0) {
      return;
    }
    do {
      lVar2 = lVar2 + 1;
      p_Var1 = p_Var1->_M_prev;
    } while (lVar2 != 0);
  }
  else {
    do {
      lVar2 = lVar2 + -1;
      p_Var1 = p_Var1->_M_next;
    } while (lVar2 != 0);
  }
  (this->_current_sequence)._M_node = p_Var1;
  return;
}

Assistant:

LubyRestartsSchedule::LubyRestartsSchedule(const LubyRestartsSchedule & other) :
    _backtracks_remaining(other._backtracks_remaining),
    _sequence(other._sequence),
    _current_sequence(_sequence.begin())
{
    advance(_current_sequence, distance(other._sequence.begin(), other._current_sequence));
}